

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O1

int bio_read_full(BIO *bio,uint8_t *out,int *out_eof_on_first_read,size_t len)

{
  byte bVar1;
  uint uVar2;
  int len_00;
  
  bVar1 = 1;
  do {
    if (len == 0) {
      return 1;
    }
    len_00 = 0x7fffffff;
    if ((len & 0xffffffff80000000) == 0) {
      len_00 = (int)len;
    }
    uVar2 = BIO_read((BIO *)bio,out,len_00);
    if ((int)uVar2 < 1) {
      if (out_eof_on_first_read != (int *)0x0) {
        *out_eof_on_first_read = (uint)(uVar2 == 0 & bVar1);
      }
    }
    else {
      out = out + uVar2;
      len = len - uVar2;
      bVar1 = 0;
    }
  } while (0 < (int)uVar2);
  return 0;
}

Assistant:

static int bio_read_full(BIO *bio, uint8_t *out, int *out_eof_on_first_read,
                         size_t len) {
  int first_read = 1;
  while (len > 0) {
    int todo = len <= INT_MAX ? (int)len : INT_MAX;
    int ret = BIO_read(bio, out, todo);
    if (ret <= 0) {
      if (out_eof_on_first_read != NULL) {
        *out_eof_on_first_read = first_read && ret == 0;
      }
      return 0;
    }
    out += ret;
    len -= (size_t)ret;
    first_read = 0;
  }

  return 1;
}